

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPreviewSurface>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPreviewSurface *surface,string *warn,string *err,PrimReconstructOptions *options)

{
  long *plVar1;
  _Base_ptr *var;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  undefined1 *puVar5;
  undefined7 uVar6;
  void *pvVar7;
  pointer pcVar8;
  string *__rhs;
  size_type sVar9;
  char cVar10;
  int iVar11;
  ostream *poVar12;
  long *plVar13;
  optional<tinyusdz::value::normal3f> *poVar14;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  *pvVar15;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined8 extraout_RAX_00;
  undefined1 *extraout_RAX_01;
  undefined1 *puVar18;
  const_iterator cVar19;
  mapped_type *this;
  _Base_ptr p_Var20;
  uint uVar21;
  Property *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  undefined8 __n;
  ulong uVar23;
  _Alloc_hider _Var24;
  string *psVar25;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  bool bVar28;
  bool bVar29;
  ParseResult ret_10;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string attr_type_name;
  undefined1 local_620 [16];
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  local_610;
  bool bStack_5f8;
  ostringstream local_5e9;
  undefined1 local_5e8 [8];
  uint *local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  undefined1 local_5b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0 [2];
  string *local_580;
  uint local_574;
  Property *local_570;
  _Base_ptr local_568;
  undefined8 local_560;
  _Base_ptr local_558;
  UsdPreviewSurface *local_550;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  string local_518;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 uStack_4d8;
  undefined7 uStack_4d7;
  bool bStack_4d0;
  undefined7 uStack_4cf;
  undefined1 local_4c8;
  ios_base local_488 [16];
  ios_base local_478 [264];
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string *local_330;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *local_328;
  AttrMetas *local_320;
  string local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  undefined8 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Base_ptr local_2b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2b0;
  TypedTerminalAttribute<tinyusdz::Token> *local_2a8;
  TypedTerminalAttribute<tinyusdz::Token> *local_2a0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_298;
  TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *local_290;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_288;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_280;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_278;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_270;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_268;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_260;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_258;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_250;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_248;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_240;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_238;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_230;
  _Base_ptr local_228;
  string local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  long local_1b0 [2];
  string local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined8 local_3d;
  float local_35;
  
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_548._M_t._M_impl.super__Rb_tree_header._M_header;
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_548._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_550 = surface;
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4f8._0_8_ = local_4e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_548,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8);
  if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
    operator_delete((void *)local_4f8._0_8_,CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
  }
  p_Var20 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_228 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_5b9 = p_Var20 == local_228;
  if (!local_5b9) {
    local_230 = &local_550->diffuseColor;
    local_238 = &local_550->emissiveColor;
    local_240 = &local_550->roughness;
    local_248 = &local_550->specularColor;
    local_250 = &local_550->metallic;
    local_258 = &local_550->clearcoat;
    local_260 = &local_550->clearcoatRoughness;
    local_268 = &local_550->opacity;
    local_270 = &local_550->opacityThreshold;
    local_278 = &local_550->ior;
    local_320 = &(local_550->normal)._metas;
    local_298 = &(local_550->normal)._paths;
    local_328 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                &(local_550->normal)._attrib;
    local_280 = &local_550->displacement;
    local_288 = &local_550->occlusion;
    local_290 = &local_550->useSpecularWorkflow;
    local_2a0 = &local_550->outputsSurface;
    local_2a8 = &local_550->outputsDisplacement;
    local_2b0 = &(local_550->super_ShaderNode).super_UsdShadePrim.props;
    local_580 = err;
    local_330 = warn;
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,*(long *)(p_Var20 + 1),
                 (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
      psVar25 = (string *)local_4f8;
      local_568 = p_Var20;
      local_4f8._0_8_ = local_4e8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar25,"inputs:diffuseColor","");
      local_570 = (Property *)(p_Var20 + 2);
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                ((ParseResult *)local_5b8,&local_548,&local_60,(Property *)(p_Var20 + 2),psVar25,
                 local_230);
      if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
        operator_delete((void *)local_4f8._0_8_,CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      p_Var20 = local_568;
      uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
      iVar11 = 0;
      if ((uVar21 & 0xfffffffd) == 0) {
        iVar11 = 3;
LAB_00230907:
        bVar28 = false;
      }
      else {
        bVar28 = true;
        if (uVar21 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4f8,0xf98);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          local_5e8 = (undefined1  [8])&local_5d8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[20],std::__cxx11::string>
                    ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:diffuseColor",
                     (char (*) [20])(local_5b8 + 8),psVar25);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f8,
                               (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                               CONCAT26(local_620._14_2_,CONCAT24(local_620._12_2_,local_620._8_4_))
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
               *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
            operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             *)CONCAT26(local_620._6_2_,local_620._0_6_),
                            (long)local_610.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
          }
          psVar25 = local_580;
          if (local_5e8 != (undefined1  [8])&local_5d8) {
            operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
          }
          if (psVar25 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar13 = (long *)::std::__cxx11::string::_M_append
                                        (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
            local_620._0_6_ = SUB86(&local_610,0);
            local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
            lVar3 = *plVar13;
            plVar1 = plVar13 + 2;
            if ((long *)lVar3 == plVar1) {
              local_610.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              local_610.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
              local_610.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                   (undefined7)((ulong)plVar13[3] >> 8);
            }
            else {
              local_620._0_6_ = (undefined6)lVar3;
              local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              local_610.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
            }
            lVar3 = plVar13[1];
            local_620._8_4_ = (undefined4)lVar3;
            local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
            local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
            *plVar13 = (long)plVar1;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_620._6_2_,local_620._0_6_),
                              (long)local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5e8 != (undefined1  [8])&local_5d8) {
              operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
          ::std::ios_base::~ios_base(local_488);
          iVar11 = 1;
          goto LAB_00230907;
        }
      }
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
      if (paVar17 != local_5a0) {
        operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
      }
      if (bVar28) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,*(long *)(p_Var20 + 1),
                   (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
        psVar25 = (string *)local_4f8;
        local_4f8._0_8_ = local_4e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar25,"inputs:emissiveColor","");
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  ((ParseResult *)local_5b8,&local_548,&local_80,local_570,psVar25,local_238);
        if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
          operator_delete((void *)local_4f8._0_8_,CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
        iVar11 = 0;
        if ((uVar21 & 0xfffffffd) == 0) {
          iVar11 = 3;
LAB_00230c25:
          bVar28 = false;
        }
        else {
          bVar28 = true;
          if (uVar21 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4f8,0xf9a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_5e8 = (undefined1  [8])&local_5d8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[21],std::__cxx11::string>
                      ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:emissiveColor",
                       (char (*) [21])(local_5b8 + 8),psVar25);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f8,
                                 (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                 CONCAT26(local_620._14_2_,
                                          CONCAT24(local_620._12_2_,local_620._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_620._6_2_,local_620._0_6_),
                              (long)local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            psVar25 = local_580;
            if (local_5e8 != (undefined1  [8])&local_5d8) {
              operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
            }
            if (psVar25 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar13 = (long *)::std::__cxx11::string::_M_append
                                          (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
              local_620._0_6_ = SUB86(&local_610,0);
              local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
              lVar3 = *plVar13;
              plVar1 = plVar13 + 2;
              if ((long *)lVar3 == plVar1) {
                local_610.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_610.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
                local_610.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar13[3] >> 8);
              }
              else {
                local_620._0_6_ = (undefined6)lVar3;
                local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_610.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar13[1];
              local_620._8_4_ = (undefined4)lVar3;
              local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar13 = (long)plVar1;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                (long)local_610.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5e8 != (undefined1  [8])&local_5d8) {
                operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
            ::std::ios_base::~ios_base(local_488);
            iVar11 = 1;
            goto LAB_00230c25;
          }
        }
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
        if (paVar17 != local_5a0) {
          operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
        }
        if (bVar28) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,*(long *)(p_Var20 + 1),
                     (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
          psVar25 = (string *)local_4f8;
          local_4f8._0_8_ = local_4e8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar25,"inputs:roughness","")
          ;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_5b8,&local_548,&local_a0,local_570,psVar25,local_240);
          if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
            operator_delete((void *)local_4f8._0_8_,CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
          iVar11 = 0;
          if ((uVar21 & 0xfffffffd) == 0) {
            iVar11 = 3;
LAB_00230f43:
            bVar28 = false;
          }
          else {
            bVar28 = true;
            if (uVar21 != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f8,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"():",3);
              poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4f8,0xf9c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              local_5e8 = (undefined1  [8])&local_5d8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[17],std::__cxx11::string>
                        ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:roughness",
                         (char (*) [17])(local_5b8 + 8),psVar25);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f8,
                                   (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                   CONCAT26(local_620._14_2_,
                                            CONCAT24(local_620._12_2_,local_620._8_4_)));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                (long)local_610.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              psVar25 = local_580;
              if (local_5e8 != (undefined1  [8])&local_5d8) {
                operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
              }
              if (psVar25 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar13 = (long *)::std::__cxx11::string::_M_append
                                            (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
                local_620._0_6_ = SUB86(&local_610,0);
                local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                lVar3 = *plVar13;
                plVar1 = plVar13 + 2;
                if ((long *)lVar3 == plVar1) {
                  local_610.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                  local_610.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
                  local_610.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                       (undefined7)((ulong)plVar13[3] >> 8);
                }
                else {
                  local_620._0_6_ = (undefined6)lVar3;
                  local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                  local_610.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                }
                lVar3 = plVar13[1];
                local_620._8_4_ = (undefined4)lVar3;
                local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
                local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                *plVar13 = (long)plVar1;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
                if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                     *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                  operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                   *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                  (long)local_610.
                                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
                }
                if (local_5e8 != (undefined1  [8])&local_5d8) {
                  operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
              ::std::ios_base::~ios_base(local_488);
              iVar11 = 1;
              goto LAB_00230f43;
            }
          }
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
          if (paVar17 != local_5a0) {
            operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
          }
          if (bVar28) {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,*(long *)(p_Var20 + 1),
                       (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
            psVar25 = (string *)local_4f8;
            local_4f8._0_8_ = local_4e8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)psVar25,"inputs:specularColor","");
            anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                      ((ParseResult *)local_5b8,&local_548,&local_c0,local_570,psVar25,local_248);
            if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
              operator_delete((void *)local_4f8._0_8_,CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
            iVar11 = 0;
            if ((uVar21 & 0xfffffffd) == 0) {
              iVar11 = 3;
LAB_00231261:
              bVar28 = false;
            }
            else {
              bVar28 = true;
              if (uVar21 != 1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"():",3);
                poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4f8,0xf9e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                local_5e8 = (undefined1  [8])&local_5d8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[21],std::__cxx11::string>
                          ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:specularColor",
                           (char (*) [21])(local_5b8 + 8),psVar25);
                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f8,
                                     (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                     CONCAT26(local_620._14_2_,
                                              CONCAT24(local_620._12_2_,local_620._8_4_)));
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                     *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                  operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                   *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                  (long)local_610.
                                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
                }
                psVar25 = local_580;
                if (local_5e8 != (undefined1  [8])&local_5d8) {
                  operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                }
                if (psVar25 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar13 = (long *)::std::__cxx11::string::_M_append
                                              (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
                  local_620._0_6_ = SUB86(&local_610,0);
                  local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                  lVar3 = *plVar13;
                  plVar1 = plVar13 + 2;
                  if ((long *)lVar3 == plVar1) {
                    local_610.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                    local_610.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
                    local_610.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                         (undefined7)((ulong)plVar13[3] >> 8);
                  }
                  else {
                    local_620._0_6_ = (undefined6)lVar3;
                    local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                    local_610.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                  }
                  lVar3 = plVar13[1];
                  local_620._8_4_ = (undefined4)lVar3;
                  local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
                  local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                  *plVar13 = (long)plVar1;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
                  if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                       *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                    operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                    (long)local_610.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1);
                  }
                  if (local_5e8 != (undefined1  [8])&local_5d8) {
                    operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                ::std::ios_base::~ios_base(local_488);
                iVar11 = 1;
                goto LAB_00231261;
              }
            }
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
            if (paVar17 != local_5a0) {
              operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
            }
            if (bVar28) {
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,*(long *)(p_Var20 + 1),
                         (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
              psVar25 = (string *)local_4f8;
              local_4f8._0_8_ = local_4e8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)psVar25,"inputs:metallic","");
              anon_unknown_0::ParseTypedAttribute<float>
                        ((ParseResult *)local_5b8,&local_548,&local_e0,local_570,psVar25,local_250);
              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                operator_delete((void *)local_4f8._0_8_,
                                CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
              iVar11 = 0;
              if ((uVar21 & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0023157f:
                bVar28 = false;
              }
              else {
                bVar28 = true;
                if (uVar21 != 1) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4f8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4f8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4f8,4000);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  local_5e8 = (undefined1  [8])&local_5d8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[16],std::__cxx11::string>
                            ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:metallic",
                             (char (*) [16])(local_5b8 + 8),psVar25);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4f8,
                                       (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                       CONCAT26(local_620._14_2_,
                                                CONCAT24(local_620._12_2_,local_620._8_4_)));
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                       *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                    operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                    (long)local_610.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1);
                  }
                  psVar25 = local_580;
                  if (local_5e8 != (undefined1  [8])&local_5d8) {
                    operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                  }
                  if (psVar25 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar13 = (long *)::std::__cxx11::string::_M_append
                                                (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
                    local_620._0_6_ = SUB86(&local_610,0);
                    local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                    lVar3 = *plVar13;
                    plVar1 = plVar13 + 2;
                    if ((long *)lVar3 == plVar1) {
                      local_610.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                      local_610.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
                      local_610.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                           (undefined7)((ulong)plVar13[3] >> 8);
                    }
                    else {
                      local_620._0_6_ = (undefined6)lVar3;
                      local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                      local_610.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                    }
                    lVar3 = plVar13[1];
                    local_620._8_4_ = (undefined4)lVar3;
                    local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
                    local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                    *plVar13 = (long)plVar1;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
                    if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                         *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                      operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                       *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                      (long)local_610.
                                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1);
                    }
                    if (local_5e8 != (undefined1  [8])&local_5d8) {
                      operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                  ::std::ios_base::~ios_base(local_488);
                  iVar11 = 1;
                  goto LAB_0023157f;
                }
              }
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
              if (paVar17 != local_5a0) {
                operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
              }
              if (bVar28) {
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_100,*(long *)(p_Var20 + 1),
                           (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
                psVar25 = (string *)local_4f8;
                local_4f8._0_8_ = local_4e8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)psVar25,"inputs:clearcoat","");
                anon_unknown_0::ParseTypedAttribute<float>
                          ((ParseResult *)local_5b8,&local_548,&local_100,local_570,psVar25,
                           local_258);
                if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                  operator_delete((void *)local_4f8._0_8_,
                                  CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
                iVar11 = 0;
                if ((uVar21 & 0xfffffffd) == 0) {
                  iVar11 = 3;
LAB_0023189d:
                  bVar28 = false;
                }
                else {
                  bVar28 = true;
                  if (uVar21 != 1) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f8,"():",3);
                    poVar12 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_4f8,0xfa2);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                    local_5e8 = (undefined1  [8])&local_5d8;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[17],std::__cxx11::string>
                              ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:clearcoat",
                               (char (*) [17])(local_5b8 + 8),psVar25);
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4f8,
                                         (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                         CONCAT26(local_620._14_2_,
                                                  CONCAT24(local_620._12_2_,local_620._8_4_)));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                    if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                         *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                      operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                       *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                      (long)local_610.
                                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1);
                    }
                    psVar25 = local_580;
                    if (local_5e8 != (undefined1  [8])&local_5d8) {
                      operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                    }
                    if (psVar25 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar13 = (long *)::std::__cxx11::string::_M_append
                                                  (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
                      local_620._0_6_ = SUB86(&local_610,0);
                      local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                      lVar3 = *plVar13;
                      plVar1 = plVar13 + 2;
                      if ((long *)lVar3 == plVar1) {
                        local_610.
                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                        local_610.
                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
                        local_610.
                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                             (undefined7)((ulong)plVar13[3] >> 8);
                      }
                      else {
                        local_620._0_6_ = (undefined6)lVar3;
                        local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                        local_610.
                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                      }
                      lVar3 = plVar13[1];
                      local_620._8_4_ = (undefined4)lVar3;
                      local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
                      local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                      *plVar13 = (long)plVar1;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
                      if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                           *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                        operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                         *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                        (long)local_610.
                                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1);
                      }
                      if (local_5e8 != (undefined1  [8])&local_5d8) {
                        operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                    ::std::ios_base::~ios_base(local_488);
                    iVar11 = 1;
                    goto LAB_0023189d;
                  }
                }
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                if (paVar17 != local_5a0) {
                  operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                }
                if (bVar28) {
                  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_120,*(long *)(p_Var20 + 1),
                             (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
                  psVar25 = (string *)local_4f8;
                  local_4f8._0_8_ = local_4e8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)psVar25,"inputs:clearcoatRoughness","");
                  anon_unknown_0::ParseTypedAttribute<float>
                            ((ParseResult *)local_5b8,&local_548,&local_120,local_570,psVar25,
                             local_260);
                  if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                    operator_delete((void *)local_4f8._0_8_,
                                    CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_120._M_dataplus._M_p != &local_120.field_2) {
                    operator_delete(local_120._M_dataplus._M_p,
                                    local_120.field_2._M_allocated_capacity + 1);
                  }
                  uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
                  iVar11 = 0;
                  if ((uVar21 & 0xfffffffd) == 0) {
                    iVar11 = 3;
LAB_00231bbb:
                    bVar28 = false;
                  }
                  else {
                    bVar28 = true;
                    if (uVar21 != 1) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f8,"ReconstructShader",0x11);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f8,"():",3);
                      poVar12 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_4f8,0xfa4);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                      local_5e8 = (undefined1  [8])&local_5d8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}","");
                      fmt::format<char[26],std::__cxx11::string>
                                ((string *)local_620,(fmt *)local_5e8,
                                 (string *)"inputs:clearcoatRoughness",
                                 (char (*) [26])(local_5b8 + 8),psVar25);
                      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4f8,
                                           (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                           CONCAT26(local_620._14_2_,
                                                    CONCAT24(local_620._12_2_,local_620._8_4_)));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                           *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                        operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                         *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                        (long)local_610.
                                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1);
                      }
                      psVar25 = local_580;
                      if (local_5e8 != (undefined1  [8])&local_5d8) {
                        operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                      }
                      if (psVar25 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar13 = (long *)::std::__cxx11::string::_M_append
                                                    (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p);
                        local_620._0_6_ = SUB86(&local_610,0);
                        local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                        lVar3 = *plVar13;
                        plVar1 = plVar13 + 2;
                        if ((long *)lVar3 == plVar1) {
                          local_610.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                          local_610.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar13[3];
                          local_610.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                               (undefined7)((ulong)plVar13[3] >> 8);
                        }
                        else {
                          local_620._0_6_ = (undefined6)lVar3;
                          local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                          local_610.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                        }
                        lVar3 = plVar13[1];
                        local_620._8_4_ = (undefined4)lVar3;
                        local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
                        local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                        *plVar13 = (long)plVar1;
                        plVar13[1] = 0;
                        *(undefined1 *)(plVar13 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
                        if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                          operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                           *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                          (long)local_610.
                                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 1);
                        }
                        if (local_5e8 != (undefined1  [8])&local_5d8) {
                          operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                      ::std::ios_base::~ios_base(local_488);
                      iVar11 = 1;
                      goto LAB_00231bbb;
                    }
                  }
                  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                  if (paVar17 != local_5a0) {
                    operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                  }
                  if (bVar28) {
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_140,*(long *)(p_Var20 + 1),
                               (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
                    psVar25 = (string *)local_4f8;
                    local_4f8._0_8_ = local_4e8;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)psVar25,"inputs:opacity","");
                    anon_unknown_0::ParseTypedAttribute<float>
                              ((ParseResult *)local_5b8,&local_548,&local_140,local_570,psVar25,
                               local_268);
                    if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                      operator_delete((void *)local_4f8._0_8_,
                                      CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p,
                                      local_140.field_2._M_allocated_capacity + 1);
                    }
                    uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
                    iVar11 = 0;
                    if ((uVar21 & 0xfffffffd) == 0) {
                      iVar11 = 3;
LAB_00231ed9:
                      bVar28 = false;
                    }
                    else {
                      bVar28 = true;
                      if (uVar21 != 1) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f8,"ReconstructShader",0x11);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f8,"():",3);
                        poVar12 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_4f8,0xfa6);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                        local_5e8 = (undefined1  [8])&local_5d8;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}",""
                                  );
                        fmt::format<char[15],std::__cxx11::string>
                                  ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:opacity",
                                   (char (*) [15])(local_5b8 + 8),psVar25);
                        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4f8,
                                             (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                             CONCAT26(local_620._14_2_,
                                                      CONCAT24(local_620._12_2_,local_620._8_4_)));
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                        if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                          operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                           *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                          (long)local_610.
                                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 1);
                        }
                        psVar25 = local_580;
                        if (local_5e8 != (undefined1  [8])&local_5d8) {
                          operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                        }
                        if (psVar25 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          plVar13 = (long *)::std::__cxx11::string::_M_append
                                                      (local_5e8,(ulong)(psVar25->_M_dataplus)._M_p)
                          ;
                          local_620._0_6_ = SUB86(&local_610,0);
                          local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                          lVar3 = *plVar13;
                          plVar1 = plVar13 + 2;
                          if ((long *)lVar3 == plVar1) {
                            local_610.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                            local_610.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
                                 (undefined1)plVar13[3];
                            local_610.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                                 (undefined7)((ulong)plVar13[3] >> 8);
                          }
                          else {
                            local_620._0_6_ = (undefined6)lVar3;
                            local_620._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                            local_610.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                          }
                          lVar3 = plVar13[1];
                          local_620._8_4_ = (undefined4)lVar3;
                          local_620._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
                          local_620._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                          *plVar13 = (long)plVar1;
                          plVar13[1] = 0;
                          *(undefined1 *)(plVar13 + 2) = 0;
                          ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620);
                          if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                            operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                             *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                            (long)local_610.
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                          }
                          if (local_5e8 != (undefined1  [8])&local_5d8) {
                            operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                        ::std::ios_base::~ios_base(local_488);
                        iVar11 = 1;
                        goto LAB_00231ed9;
                      }
                    }
                    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                    if (paVar17 != local_5a0) {
                      operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                    }
                    if (bVar28) {
                      local_160._M_allocated_capacity = (size_type)&local_150;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_160,*(long *)(p_Var20 + 1),
                                 (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
                      psVar25 = (string *)local_4f8;
                      local_4f8._0_8_ = local_4e8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)psVar25,"inputs:opacityThreshold","");
                      anon_unknown_0::ParseTypedAttribute<float>
                                ((ParseResult *)local_5b8,&local_548,(string *)&local_160,local_570,
                                 psVar25,local_270);
                      if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                        operator_delete((void *)local_4f8._0_8_,
                                        CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_160._M_allocated_capacity != &local_150) {
                        operator_delete((void *)local_160._M_allocated_capacity,
                                        local_150._M_allocated_capacity + 1);
                      }
                      uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
                      iVar11 = 0;
                      if ((uVar21 & 0xfffffffd) == 0) {
                        iVar11 = 3;
LAB_002321ae:
                        bVar28 = false;
                      }
                      else {
                        bVar28 = true;
                        if (uVar21 != 1) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f8,"ReconstructShader",0x11);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f8,"():",3);
                          poVar12 = (ostream *)
                                    ::std::ostream::operator<<((ostringstream *)local_4f8,0xfa8);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                          local_5e8 = (undefined1  [8])&local_5d8;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_5e8,"Parsing attribute `{}` failed. Error: {}",
                                     "");
                          fmt::format<char[24],std::__cxx11::string>
                                    ((string *)local_620,(fmt *)local_5e8,
                                     (string *)"inputs:opacityThreshold",
                                     (char (*) [24])(local_5b8 + 8),psVar25);
                          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4f8,
                                               (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                               CONCAT26(local_620._14_2_,
                                                        CONCAT24(local_620._12_2_,local_620._8_4_)))
                          ;
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                          if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                            operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                             *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                            (long)local_610.
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                          }
                          psVar25 = local_580;
                          if (local_5e8 != (undefined1  [8])&local_5d8) {
                            operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1);
                          }
                          if (psVar25 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_620,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_5e8,psVar25);
                            ::std::__cxx11::string::operator=((string *)psVar25,(string *)local_620)
                            ;
                            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                               *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                              (long)local_610.
                                                                                                        
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                            }
                            if (local_5e8 != (undefined1  [8])&local_5d8) {
                              operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1)
                              ;
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
                          ::std::ios_base::~ios_base(local_488);
                          iVar11 = 1;
                          goto LAB_002321ae;
                        }
                      }
                      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                      if (paVar17 != local_5a0) {
                        operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                      }
                      if (bVar28) {
                        local_180._M_allocated_capacity = (size_type)&local_170;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_180,*(long *)(p_Var20 + 1),
                                   (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1))
                        ;
                        psVar25 = (string *)local_4f8;
                        local_4f8._0_8_ = local_4e8;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)psVar25,"inputs:ior","");
                        args = local_570;
                        anon_unknown_0::ParseTypedAttribute<float>
                                  ((ParseResult *)local_5b8,&local_548,(string *)&local_180,
                                   local_570,psVar25,local_278);
                        if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                          operator_delete((void *)local_4f8._0_8_,
                                          CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_180._M_allocated_capacity != &local_170) {
                          operator_delete((void *)local_180._M_allocated_capacity,
                                          local_170._M_allocated_capacity + 1);
                        }
                        uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
                        iVar11 = 0;
                        if ((uVar21 & 0xfffffffd) == 0) {
                          iVar11 = 3;
LAB_00232483:
                          bVar28 = false;
                        }
                        else {
                          bVar28 = true;
                          if (uVar21 != 1) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4f8,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4f8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4f8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4f8,"ReconstructShader",0x11);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4f8,"():",3);
                            poVar12 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)local_4f8,0xfaa);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                            local_5e8 = (undefined1  [8])&local_5d8;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_5e8,
                                       "Parsing attribute `{}` failed. Error: {}","");
                            args = (Property *)(local_5b8 + 8);
                            fmt::format<char[11],std::__cxx11::string>
                                      ((string *)local_620,(fmt *)local_5e8,(string *)"inputs:ior",
                                       (char (*) [11])args,psVar25);
                            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4f8,
                                                 (char *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                 CONCAT26(local_620._14_2_,
                                                          CONCAT24(local_620._12_2_,local_620._8_4_)
                                                         ));
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                               *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                              (long)local_610.
                                                                                                        
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                            }
                            __rhs = local_580;
                            if (local_5e8 != (undefined1  [8])&local_5d8) {
                              operator_delete((void *)local_5e8,local_5d8._M_allocated_capacity + 1)
                              ;
                            }
                            if (__rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_620,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_5e8,__rhs);
                              ::std::__cxx11::string::operator=((string *)__rhs,(string *)local_620)
                              ;
                              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                   *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                 *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                (long)local_610.
                                                                                                            
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                              }
                              if (local_5e8 != (undefined1  [8])&local_5d8) {
                                operator_delete((void *)local_5e8,
                                                local_5d8._M_allocated_capacity + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_4f8);
                            ::std::ios_base::~ios_base(local_488);
                            iVar11 = 1;
                            goto LAB_00232483;
                          }
                        }
                        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT17(local_5b0[7],CONCAT43(local_5b0._3_4_,local_5b0._0_3_)
                                             );
                        if (paVar17 != local_5a0) {
                          operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                        }
                        if (bVar28) {
                          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
                          ::std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_2f8,*(long *)(p_Var20 + 1),
                                     (long)&(p_Var20[1]._M_parent)->_M_color +
                                     *(long *)(p_Var20 + 1));
                          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_370,"inputs:normal","");
                          uVar16 = local_2f8._8_8_;
                          sVar9 = local_370._M_string_length;
                          local_5e0 = (uint *)(local_5d8._M_local_buf + 8);
                          local_5d8._M_allocated_capacity = 0;
                          local_5d8._M_local_buf[8] = '\0';
                          __n = local_2f8._8_8_;
                          if (local_370._M_string_length < (ulong)local_2f8._8_8_) {
                            __n = local_370._M_string_length;
                          }
                          if (__n == 0) {
                            bVar28 = true;
                          }
                          else {
                            iVar11 = bcmp((void *)local_2f8._M_allocated_capacity,
                                          local_370._M_dataplus._M_p,__n);
                            bVar28 = iVar11 == 0;
                          }
                          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT71((int7)((ulong)args >> 8),uVar16 != sVar9);
                          if ((bool)(bVar28 ^ 1U | uVar16 != sVar9)) {
                            local_5e8._0_4_ = 1;
                          }
                          else {
                            if (((ulong)p_Var20[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000
                               ) {
                              local_5e8._0_4_ = 7;
                              puVar18 = local_5b0 + 8;
                              local_5b8[0] = SUB81(puVar18,0);
                              local_5b8._1_2_ = (undefined2)((ulong)puVar18 >> 8);
                              local_5b8[3] = (undefined1)((ulong)puVar18 >> 0x18);
                              local_5b8._4_4_ = (undefined4)((ulong)puVar18 >> 0x20);
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_5b8,
                                         "Property {} must be Attribute, but declared as Relationhip."
                                         ,"");
                              fmt::format<std::__cxx11::string>
                                        ((string *)local_4f8,(fmt *)local_5b8,&local_370,pbVar22);
                              ::std::__cxx11::string::operator=
                                        ((string *)&local_5e0,(string *)local_4f8);
                              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                operator_delete((void *)local_4f8._0_8_,
                                                CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                              }
                              _Var24._M_p = (pointer)CONCAT44(local_5b8._4_4_,
                                                              CONCAT13(local_5b8[3],
                                                                       CONCAT21(local_5b8._1_2_,
                                                                                local_5b8[0])));
                              if (_Var24._M_p == local_5b0 + 8) goto LAB_00233096;
                              uVar16 = CONCAT26(local_5b0._14_2_,local_5b0._8_6_);
                            }
                            else {
                              Attribute::type_name_abi_cxx11_(&local_318,&local_570->_attrib);
                              local_4f8._0_8_ = local_4e8;
                              local_4e8._0_6_ = 0x6c616d726f6e;
                              local_4e8._6_2_ = 0x6633;
                              local_4f8._8_4_ = 8;
                              local_4f8._12_2_ = 0;
                              local_4f8._14_2_ = 0;
                              local_4e8[8] = '\0';
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_318._M_string_length ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x8) {
                                bVar28 = *(long *)local_318._M_dataplus._M_p == 0x66336c616d726f6e;
                              }
                              else {
                                bVar28 = false;
                              }
                              bVar29 = true;
                              pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_318._M_string_length;
                              if (!bVar28) {
                                local_2d8 = &local_2c8;
                                local_2c8._M_allocated_capacity._4_2_ = 0x3374;
                                local_2c8._M_allocated_capacity._0_4_ = 0x616f6c66;
                                local_2d0 = 6;
                                local_2c8._M_local_buf[6] = '\0';
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_318._M_string_length ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x6) {
                                  uVar21 = (uint)(ushort)((ushort)*(uint *)(local_318._M_dataplus.
                                                                            _M_p + 4) ^ 0x3374) |
                                           *(uint *)local_318._M_dataplus._M_p ^ 0x616f6c66;
                                  bVar29 = uVar21 == 0;
                                  pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(ulong)uVar21;
                                }
                                else {
                                  bVar29 = false;
                                }
                              }
                              if ((!bVar28) && (local_2d8 != &local_2c8)) {
                                operator_delete(local_2d8,
                                                CONCAT17(local_2c8._M_local_buf[7],
                                                         CONCAT16(local_2c8._M_local_buf[6],
                                                                  CONCAT24(local_2c8.
                                                                           _M_allocated_capacity.
                                                                           _4_2_,local_2c8.
                                                                                                                                                                  
                                                  _M_allocated_capacity._0_4_))) + 1);
                              }
                              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                operator_delete((void *)local_4f8._0_8_,
                                                CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                              }
                              if (bVar29) {
                                p_Var26 = p_Var20[6]._M_parent;
                                p_Var27 = p_Var20[6]._M_left;
                                if (p_Var27 != p_Var26) {
                                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::
                                  operator=((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                             *)local_298,
                                            (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                             *)&p_Var20[6]._M_parent);
                                }
                                iVar11 = *(int *)((long)&p_Var20[0x17]._M_parent + 4);
                                if (iVar11 == 1) {
                                  if (p_Var20[5]._M_left == p_Var20[5]._M_parent) {
                                    if (p_Var20[4]._M_right == (_Base_ptr)0x0) {
                                      bVar28 = false;
                                    }
                                    else {
                                      iVar11 = (**(code **)p_Var20[4]._M_right)();
                                      bVar28 = iVar11 == 4;
                                    }
                                    if ((!bVar28) && ((p_Var20[5]._M_color & _S_black) == _S_red))
                                    goto LAB_00232954;
                                    (local_550->normal)._blocked = true;
LAB_00232b1a:
                                    local_574 = 0;
LAB_00232b2a:
                                    local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                                    local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                                    bStack_5f8 = false;
                                    local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                    local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
                                    local_610.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                                    local_620._8_4_ = 0.0;
                                    local_620[0xc] = false;
                                    local_620[0xd] = false;
                                    local_620._0_6_ = 0;
                                    local_620._6_2_ = 0;
                                    var = &p_Var20[4]._M_parent;
                                    local_558 = p_Var27;
                                    local_2b8 = p_Var26;
                                    if (p_Var20[5]._M_left == p_Var20[5]._M_parent) {
                                      local_560 = 0;
LAB_00232da4:
                                      if ((char)p_Var20[5]._M_color == _S_red) {
                                        if (p_Var20[4]._M_right == (_Base_ptr)0x0) {
LAB_00232dc0:
                                          if (p_Var20[4]._M_right != (_Base_ptr)0x0) {
                                            iVar11 = (**(code **)p_Var20[4]._M_right)();
                                            pcVar8 = (pointer)local_4f8._0_8_;
                                            if (iVar11 == 1) goto LAB_00232dd3;
                                          }
                                          goto LAB_00232de2;
                                        }
                                        iVar11 = (**(code **)p_Var20[4]._M_right)();
                                        pcVar8 = (pointer)local_4f8._0_8_;
                                        if (iVar11 != 0) goto LAB_00232dc0;
LAB_00232dd3:
                                        bVar29 = false;
                                      }
                                      else {
LAB_00232de2:
                                        primvar::PrimVar::get_value<tinyusdz::value::normal3f>
                                                  ((optional<tinyusdz::value::normal3f> *)local_4f8,
                                                   (PrimVar *)var);
                                        if (local_4f8[0] == (ostringstream)0x1) {
                                          local_620._8_4_ =
                                               CONCAT22(local_4f8._14_2_,local_4f8._12_2_);
                                          local_3d = CONCAT44(local_4f8._8_4_,local_4f8._4_4_);
                                          local_620._0_6_ = (undefined6)local_3d;
                                          local_620._6_2_ = SUB42(local_4f8._8_4_,2);
                                          local_620[0xc] = true;
                                          local_620[0xd] = false;
                                          local_35 = (float)local_620._8_4_;
                                          pcVar8 = (pointer)local_4f8._0_8_;
                                        }
                                        else {
                                          local_5e9 = local_4f8[0];
                                          local_5e8._0_4_ = 8;
                                          puVar18 = local_5b0 + 8;
                                          local_5b8[0] = SUB81(puVar18,0);
                                          local_5b8._1_2_ = (undefined2)((ulong)puVar18 >> 8);
                                          local_5b8[3] = (undefined1)((ulong)puVar18 >> 0x18);
                                          local_5b8._4_4_ = (undefined4)((ulong)puVar18 >> 0x20);
                                          ::std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)local_5b8,
                                                                                                          
                                                  "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                                                  ,"");
                                          local_518._M_dataplus._M_p._0_3_ =
                                               SUB83(&local_518.field_2,0);
                                          local_518._M_dataplus._M_p._3_5_ =
                                               (undefined5)((ulong)&local_518.field_2 >> 0x18);
                                          local_518.field_2._M_allocated_capacity =
                                               0x66336c616d726f6e;
                                          local_518._M_string_length._0_3_ = 8;
                                          local_518._M_string_length._3_4_ = 0;
                                          local_518._M_string_length._7_1_ = 0;
                                          local_518.field_2._M_local_buf[8] = '\0';
                                          primvar::PrimVar::type_name_abi_cxx11_
                                                    (&local_350,(PrimVar *)var);
                                          fmt::format<std::__cxx11::string,std::__cxx11::string>
                                                    ((string *)local_4f8,(fmt *)local_5b8,&local_518
                                                     ,&local_350,psVar25);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)&local_5e0,(string *)local_4f8);
                                          if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                            operator_delete((void *)local_4f8._0_8_,
                                                            CONCAT26(local_4e8._6_2_,local_4e8._0_6_
                                                                    ) + 1);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_350._M_dataplus._M_p != &local_350.field_2) {
                                            operator_delete(local_350._M_dataplus._M_p,
                                                            local_350.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)CONCAT53(local_518._M_dataplus._M_p._3_5_,
                                                          local_518._M_dataplus._M_p._0_3_) !=
                                              &local_518.field_2) {
                                            operator_delete((undefined1 *)
                                                            CONCAT53(local_518._M_dataplus._M_p.
                                                                     _3_5_,local_518._M_dataplus.
                                                                           _M_p._0_3_),
                                                            local_518.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          puVar5 = (undefined1 *)
                                                   CONCAT44(local_5b8._4_4_,
                                                            CONCAT13(local_5b8[3],
                                                                     CONCAT21(local_5b8._1_2_,
                                                                              local_5b8[0])));
                                          puVar18 = local_5b0 + 8;
                                          pcVar8 = (pointer)local_4f8._0_8_;
                                          if (puVar5 != puVar18) {
                                            operator_delete(puVar5,CONCAT26(local_5b0._14_2_,
                                                                            local_5b0._8_6_) + 1);
                                            puVar18 = extraout_RAX_01;
                                            pcVar8 = (pointer)local_4f8._0_8_;
                                          }
                                          local_574 = (uint)CONCAT71((int7)((ulong)puVar18 >> 8),1);
                                          p_Var20 = local_568;
                                          p_Var27 = local_558;
                                          local_4f8[0] = local_5e9;
                                        }
                                        bVar29 = true;
                                        bVar28 = false;
                                        if (local_4f8[0] == (ostringstream)0x0) {
                                          bVar29 = false;
                                          uVar16 = local_560;
                                          goto LAB_00232fe3;
                                        }
                                      }
                                      uVar16 = local_560;
                                      if (((char)local_560 != '\0') || (bVar29)) {
                                        local_4f8._0_8_ = pcVar8;
                                        nonstd::optional_lite::
                                        optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
                                        operator=(local_328,
                                                  (Animatable<tinyusdz::value::normal3f> *)local_620
                                                 );
                                        bVar28 = true;
                                        pcVar8 = (pointer)local_4f8._0_8_;
                                      }
                                      else {
                                        bVar28 = true;
                                      }
                                    }
                                    else {
                                      anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
                                                ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>
                                                  *)local_5b8,(PrimVar *)var);
                                      local_4f8[0] = local_5b8[0];
                                      local_5e9 = local_5b8[0];
                                      if (local_5b8[0] == (ostringstream)0x1) {
                                        uVar6 = CONCAT43(local_5b0._3_4_,local_5b0._0_3_);
                                        local_4e8._0_6_ = local_5b0._8_6_;
                                        local_4f8._8_4_ = (undefined4)uVar6;
                                        local_4f8._12_2_ = SUB42(local_5b0._3_4_,1);
                                        local_4f8._14_2_ =
                                             (undefined2)(CONCAT17(local_5b0[7],uVar6) >> 0x30);
                                        local_4e8[8] = (undefined1)
                                                       local_5a0[0]._M_allocated_capacity;
                                        local_4e8._9_7_ =
                                             (undefined7)((ulong)local_5a0[0]._0_8_ >> 8);
                                        uStack_4d8 = (undefined1)local_5a0[0]._8_8_;
                                        uStack_4d7 = (undefined7)((ulong)local_5a0[0]._8_8_ >> 8);
                                        bStack_4d0 = SUB81(local_5a0[1]._0_8_,0);
                                        uStack_4cf = (undefined7)((ulong)local_5a0[1]._0_8_ >> 8);
                                        local_5a0[0]._M_allocated_capacity = 0;
                                        local_5a0[0]._8_8_ = 0;
                                        local_5a0[1]._0_8_ = 0;
                                        local_4c8 = local_5a0[1]._8_1_;
                                        local_620._0_6_ = (undefined6)uVar6;
                                        local_620._6_2_ = local_4f8._14_2_;
                                        local_620._8_4_ = (undefined4)local_5b0._8_6_;
                                        local_620._12_2_ = SUB62(local_5b0._8_6_,4);
                                        pvVar15 = ::std::
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ::operator=(&local_610,
                                                              (
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)(local_4e8 + 8));
                                        uVar16 = CONCAT71((int7)((ulong)pvVar15 >> 8),local_4c8);
                                        bStack_5f8 = (bool)local_4c8;
                                      }
                                      else {
                                        local_5e8._0_4_ = 8;
                                        local_518._M_dataplus._M_p._0_3_ =
                                             SUB83(&local_518.field_2,0);
                                        local_518._M_dataplus._M_p._3_5_ =
                                             (undefined5)((ulong)&local_518.field_2 >> 0x18);
                                        ::std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_518,
                                                                                                      
                                                  "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                                                  ,"");
                                        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                                        local_350.field_2._M_allocated_capacity = 0x66336c616d726f6e
                                        ;
                                        local_350._M_string_length = 8;
                                        local_350.field_2._M_local_buf[8] = '\0';
                                        fmt::format<std::__cxx11::string,std::__cxx11::string>
                                                  ((string *)local_5b8,(fmt *)&local_518,
                                                   (string *)&local_2f8,&local_350,psVar25);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)&local_5e0,(string *)local_5b8);
                                        puVar18 = (undefined1 *)
                                                  CONCAT44(local_5b8._4_4_,
                                                           CONCAT13(local_5b8[3],
                                                                    CONCAT21(local_5b8._1_2_,
                                                                             local_5b8[0])));
                                        if (puVar18 != local_5b0 + 8) {
                                          operator_delete(puVar18,CONCAT26(local_5b0._14_2_,
                                                                           local_5b0._8_6_) + 1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_350._M_dataplus._M_p != &local_350.field_2) {
                                          operator_delete(local_350._M_dataplus._M_p,
                                                          local_350.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        paVar17 = &local_518.field_2;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)CONCAT53(local_518._M_dataplus._M_p._3_5_,
                                                        local_518._M_dataplus._M_p._0_3_) != paVar17
                                           ) {
                                          operator_delete((undefined1 *)
                                                          CONCAT53(local_518._M_dataplus._M_p._3_5_,
                                                                   local_518._M_dataplus._M_p._0_3_)
                                                          ,local_518.field_2._M_allocated_capacity +
                                                           1);
                                          paVar17 = extraout_RAX;
                                        }
                                        uVar16 = CONCAT71((int7)((ulong)paVar17 >> 8),1);
                                        local_574 = (uint)uVar16;
                                        p_Var20 = local_568;
                                        p_Var27 = local_558;
                                      }
                                      if ((local_4f8[0] == (ostringstream)0x1) &&
                                         (pvVar7 = (void *)CONCAT71(local_4e8._9_7_,local_4e8[8]),
                                         pvVar7 != (void *)0x0)) {
                                        operator_delete(pvVar7,CONCAT71(uStack_4cf,bStack_4d0) -
                                                               (long)pvVar7);
                                        uVar16 = extraout_RAX_00;
                                      }
                                      local_560 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
                                      bVar29 = false;
                                      bVar28 = false;
                                      uVar16 = 0;
                                      pcVar8 = (pointer)local_4f8._0_8_;
                                      if (local_5e9 != (ostringstream)0x0) goto LAB_00232da4;
                                    }
LAB_00232fe3:
                                    p_Var26 = local_2b8;
                                    cVar10 = (char)uVar16;
                                    local_4f8._0_8_ = pcVar8;
                                    if (local_610.
                                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                      operator_delete(local_610.
                                                                                                            
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  CONCAT71(local_610.
                                                                                                                      
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_7_,local_610.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) - (long)local_610.
                                                                                                                                    
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      p_Var27 = local_558;
                                    }
                                    if (bVar28) goto LAB_00233026;
                                  }
                                  else {
LAB_00232954:
                                    if (p_Var20[3]._M_color != _S_black) goto LAB_00232b1a;
                                    bVar28 = primvar::PrimVar::is_timesamples
                                                       ((PrimVar *)&p_Var20[4]._M_parent);
                                    if (bVar28) {
                                      local_5e8._0_4_ = 4;
                                      puVar18 = local_5b0 + 8;
                                      local_5b8[0] = SUB81(puVar18,0);
                                      local_5b8._1_2_ = (undefined2)((ulong)puVar18 >> 8);
                                      local_5b8[3] = (undefined1)((ulong)puVar18 >> 0x18);
                                      local_5b8._4_4_ = (undefined4)((ulong)puVar18 >> 0x20);
                                      ::std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_5b8,
                                                 "TimeSample value is assigned to `uniform` property `{}"
                                                 ,"");
                                      fmt::format<std::__cxx11::string>
                                                ((string *)local_4f8,(fmt *)local_5b8,&local_370,
                                                 pbVar22);
                                      ::std::__cxx11::string::operator=
                                                ((string *)&local_5e0,(string *)local_4f8);
                                      if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                        operator_delete((void *)local_4f8._0_8_,
                                                        CONCAT26(local_4e8._6_2_,local_4e8._0_6_) +
                                                        1);
                                      }
                                      puVar18 = (undefined1 *)
                                                CONCAT44(local_5b8._4_4_,
                                                         CONCAT13(local_5b8[3],
                                                                  CONCAT21(local_5b8._1_2_,
                                                                           local_5b8[0])));
                                      p_Var20 = local_568;
                                      if (puVar18 != local_5b0 + 8) {
                                        operator_delete(puVar18,CONCAT26(local_5b0._14_2_,
                                                                         local_5b0._8_6_) + 1);
                                        p_Var20 = local_568;
                                      }
                                      goto LAB_00233071;
                                    }
                                    local_558 = p_Var27;
                                    poVar14 = primvar::PrimVar::get_value<tinyusdz::value::normal3f>
                                                        ((optional<tinyusdz::value::normal3f> *)
                                                         local_4f8,(PrimVar *)&p_Var20[4]._M_parent)
                                    ;
                                    local_574 = (uint)CONCAT71((int7)((ulong)poVar14 >> 8),
                                                               local_4f8[0]);
                                    if (local_4f8[0] == (ostringstream)0x1) {
                                      local_5b0._3_4_ = CONCAT22(local_4f8._14_2_,local_4f8._12_2_);
                                      pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(local_5b8 + 8);
                                      local_5b8[3] = SUB81(local_4f8._0_8_,4);
                                      local_5b8._4_4_ =
                                           (undefined4)
                                           (CONCAT44(local_4f8._8_4_,local_4f8._4_4_) >> 8);
                                      local_5b0._0_3_ = SUB43(local_4f8._8_4_,1);
                                      local_518._M_dataplus._M_p._3_5_ =
                                           CONCAT41(local_5b8._4_4_,local_5b8[3]);
                                      local_518._M_string_length._0_3_ = local_5b0._0_3_;
                                      local_518._M_string_length._3_4_ = local_5b0._3_4_;
                                    }
                                    if (local_4f8[0] == (ostringstream)0x0) {
                                      local_5e8._0_4_ = 3;
                                      puVar18 = local_5b0 + 8;
                                      local_5b8[0] = SUB81(puVar18,0);
                                      local_5b8._1_2_ = (undefined2)((ulong)puVar18 >> 8);
                                      local_5b8[3] = (undefined1)((ulong)puVar18 >> 0x18);
                                      local_5b8._4_4_ = (undefined4)((ulong)puVar18 >> 0x20);
                                      ::std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_5b8,
                                                 "Fallback. Failed to retrieve value with requested type `{}`."
                                                 ,"");
                                      local_620._0_6_ = SUB86(&local_610,0);
                                      local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                                      local_610.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)0x66336c616d726f6e;
                                      local_620._8_4_ = 1.12104e-44;
                                      local_620[0xc] = false;
                                      local_620[0xd] = false;
                                      local_620._14_2_ = 0;
                                      local_610.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
                                      fmt::format<std::__cxx11::string>
                                                ((string *)local_4f8,(fmt *)local_5b8,
                                                 (string *)local_620,pbVar22);
                                      ::std::__cxx11::string::operator=
                                                ((string *)&local_5e0,(string *)local_4f8);
                                      if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                        operator_delete((void *)local_4f8._0_8_,
                                                        CONCAT26(local_4e8._6_2_,local_4e8._0_6_) +
                                                        1);
                                      }
                                      if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                           *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610
                                         ) {
                                        operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                      }
                                      puVar18 = (undefined1 *)
                                                CONCAT44(local_5b8._4_4_,
                                                         CONCAT13(local_5b8[3],
                                                                  CONCAT21(local_5b8._1_2_,
                                                                           local_5b8[0])));
                                      if (puVar18 != local_5b0 + 8) {
                                        uVar23 = CONCAT26(local_5b0._14_2_,local_5b0._8_6_) + 1;
                                        goto LAB_00234493;
                                      }
                                    }
                                    else {
                                      uStack_4d8 = 0;
                                      uStack_4d7 = 0;
                                      bStack_4d0 = false;
                                      local_4e8._0_6_ = 0;
                                      local_4e8._6_2_ = 0;
                                      local_4e8[8] = '\0';
                                      local_4e8._9_7_ = 0;
                                      local_4f8._0_4_ = (undefined4)local_518._M_dataplus._M_p._3_5_
                                      ;
                                      local_4f8._4_4_ =
                                           (undefined4)
                                           (CONCAT35((undefined3)local_518._M_string_length,
                                                     local_518._M_dataplus._M_p._3_5_) >> 0x20);
                                      local_4f8._8_4_ = local_518._M_string_length._3_4_;
                                      local_4f8._12_2_ = 1;
                                      nonstd::optional_lite::
                                      optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
                                      operator=(local_328,
                                                (Animatable<tinyusdz::value::normal3f> *)local_4f8);
                                      puVar18 = (undefined1 *)
                                                CONCAT26(local_4e8._6_2_,local_4e8._0_6_);
                                      if (puVar18 != (undefined1 *)0x0) {
                                        uVar23 = CONCAT71(uStack_4d7,uStack_4d8) - (long)puVar18;
LAB_00234493:
                                        operator_delete(puVar18,uVar23);
                                      }
                                    }
                                    cVar10 = (char)local_574;
                                    local_574 = local_574 ^ 1;
                                    p_Var20 = local_568;
                                    p_Var27 = local_558;
                                    if (cVar10 == '\x01') goto LAB_00232b2a;
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_318._M_dataplus._M_p != &local_318.field_2) {
                                    operator_delete(local_318._M_dataplus._M_p,
                                                    local_318.field_2._M_allocated_capacity + 1);
                                  }
                                  if (((char)local_574 != '\0') ||
                                     (local_5e0 == (uint *)(local_5d8._M_local_buf + 8)))
                                  goto LAB_00233096;
                                  uVar16 = CONCAT71(local_5d8._9_7_,local_5d8._M_local_buf[8]);
                                  _Var24._M_p = (pointer)local_5e0;
                                  goto LAB_0023308e;
                                }
                                if (iVar11 == 0) {
LAB_00232792:
                                  (local_550->normal)._empty = true;
                                }
                                else {
                                  bVar29 = false;
                                  cVar10 = '\0';
LAB_00233026:
                                  if (p_Var27 == p_Var26) {
                                    if ((cVar10 == '\0') && (!bVar29)) {
                                      ::std::__cxx11::string::operator=
                                                ((string *)&local_5e0,
                                                 "Invalid Property type(internal error)");
                                      local_5e8._0_4_ = 8;
                                      goto LAB_00233071;
                                    }
                                  }
                                  else if ((cVar10 == '\0') && (!bVar29)) goto LAB_00232792;
                                }
                                AttrMetas::operator=(local_320,(AttrMetas *)(p_Var20 + 7));
                                ::std::
                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                ::_M_insert_unique<std::__cxx11::string_const&>
                                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                            *)&local_548,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_370);
                                local_5e8 = (undefined1  [8])((ulong)local_5e8 & 0xffffffff00000000)
                                ;
                              }
                              else {
                                local_5e8._0_4_ = 3;
                                ::std::__cxx11::stringstream::stringstream
                                          ((stringstream *)local_4f8);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4e8,"Property type mismatch. ",0x18);
                                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4e8,local_370._M_dataplus._M_p
                                                     ,local_370._M_string_length);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar12," expects type `",0xf);
                                pcVar2 = local_5b0 + 8;
                                local_5b8[0] = SUB81(pcVar2,0);
                                local_5b8._1_2_ = (undefined2)((ulong)pcVar2 >> 8);
                                local_5b8[3] = (undefined1)((ulong)pcVar2 >> 0x18);
                                local_5b8._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
                                local_5b0._8_6_ = 0x6c616d726f6e;
                                local_5b0._14_2_ = 0x6633;
                                local_5b0._0_3_ = 8;
                                local_5b0._3_4_ = 0;
                                local_5b0[7] = 0;
                                local_5a0[0]._M_allocated_capacity =
                                     local_5a0[0]._M_allocated_capacity & 0xffffffffffffff00;
                                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar12,pcVar2,8);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar12,"` but defined as type `",0x17);
                                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar12,local_318._M_dataplus._M_p,
                                                     local_318._M_string_length);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"`",1);
                                pcVar4 = (char *)CONCAT44(local_5b8._4_4_,
                                                          CONCAT13(local_5b8[3],
                                                                   CONCAT21(local_5b8._1_2_,
                                                                            local_5b8[0])));
                                if (pcVar4 != pcVar2) {
                                  operator_delete(pcVar4,CONCAT26(local_5b0._14_2_,local_5b0._8_6_)
                                                         + 1);
                                }
                                ::std::__cxx11::stringbuf::str();
                                ::std::__cxx11::string::operator=
                                          ((string *)&local_5e0,(string *)local_5b8);
                                puVar18 = (undefined1 *)
                                          CONCAT44(local_5b8._4_4_,
                                                   CONCAT13(local_5b8[3],
                                                            CONCAT21(local_5b8._1_2_,local_5b8[0])))
                                ;
                                if (puVar18 != local_5b0 + 8) {
                                  operator_delete(puVar18,CONCAT26(local_5b0._14_2_,local_5b0._8_6_)
                                                          + 1);
                                }
                                ::std::__cxx11::stringstream::~stringstream
                                          ((stringstream *)local_4f8);
                                ::std::ios_base::~ios_base(local_478);
                              }
LAB_00233071:
                              uVar16 = local_318.field_2._M_allocated_capacity;
                              _Var24._M_p = local_318._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_318._M_dataplus._M_p == &local_318.field_2)
                              goto LAB_00233096;
                            }
LAB_0023308e:
                            operator_delete(_Var24._M_p,uVar16 + 1);
                          }
LAB_00233096:
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_370._M_dataplus._M_p != &local_370.field_2) {
                            operator_delete(local_370._M_dataplus._M_p,
                                            local_370.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f8._M_allocated_capacity != &local_2e8) {
                            operator_delete((void *)local_2f8._M_allocated_capacity,
                                            local_2e8._M_allocated_capacity + 1);
                          }
                          iVar11 = 0;
                          if (((ulong)local_5e8 & 0xfffffffd) == 0) {
                            iVar11 = 3;
LAB_002332df:
                            bVar28 = false;
                          }
                          else {
                            bVar28 = true;
                            if (local_5e8._0_4_ != 1) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_4f8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4f8,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4f8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4f8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4f8,"ReconstructShader",0x11);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4f8,"():",3);
                              poVar12 = (ostream *)
                                        ::std::ostream::operator<<((ostringstream *)local_4f8,0xfac)
                              ;
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                              local_620._0_6_ = SUB86(&local_610,0);
                              local_620._6_2_ = (undefined2)((ulong)&local_610 >> 0x30);
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_620,
                                         "Parsing attribute `{}` failed. Error: {}","");
                              fmt::format<char[14],std::__cxx11::string>
                                        ((string *)local_5b8,(fmt *)local_620,
                                         (string *)"inputs:normal",(char (*) [14])&local_5e0,psVar25
                                        );
                              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,
                                                   (char *)CONCAT44(local_5b8._4_4_,
                                                                    CONCAT13(local_5b8[3],
                                                                             CONCAT21(local_5b8.
                                                                                      _1_2_,
                                                  local_5b8[0]))),
                                                  CONCAT17(local_5b0[7],
                                                           CONCAT43(local_5b0._3_4_,local_5b0._0_3_)
                                                          ));
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                              puVar18 = (undefined1 *)
                                        CONCAT44(local_5b8._4_4_,
                                                 CONCAT13(local_5b8[3],
                                                          CONCAT21(local_5b8._1_2_,local_5b8[0])));
                              if (puVar18 != local_5b0 + 8) {
                                operator_delete(puVar18,CONCAT26(local_5b0._14_2_,local_5b0._8_6_) +
                                                        1);
                              }
                              psVar25 = local_580;
                              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                   *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                 *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                (long)local_610.
                                                                                                            
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                              }
                              if (psVar25 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5b8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,psVar25);
                                ::std::__cxx11::string::operator=
                                          ((string *)psVar25,(string *)local_5b8);
                                puVar18 = (undefined1 *)
                                          CONCAT44(local_5b8._4_4_,
                                                   CONCAT13(local_5b8[3],
                                                            CONCAT21(local_5b8._1_2_,local_5b8[0])))
                                ;
                                if (puVar18 != local_5b0 + 8) {
                                  operator_delete(puVar18,CONCAT26(local_5b0._14_2_,local_5b0._8_6_)
                                                          + 1);
                                }
                                if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                                  operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_4f8);
                              ::std::ios_base::~ios_base(local_488);
                              iVar11 = 1;
                              goto LAB_002332df;
                            }
                          }
                          if (local_5e0 != (uint *)(local_5d8._M_local_buf + 8)) {
                            operator_delete(local_5e0,
                                            CONCAT71(local_5d8._9_7_,local_5d8._M_local_buf[8]) + 1)
                            ;
                          }
                          if (bVar28) {
                            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                            ::std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_1a0,*(long *)(p_Var20 + 1),
                                       (long)&(p_Var20[1]._M_parent)->_M_color +
                                       *(long *)(p_Var20 + 1));
                            psVar25 = (string *)local_4f8;
                            local_4f8._0_8_ = local_4e8;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)psVar25,"inputs:dispacement","");
                            anon_unknown_0::ParseTypedAttribute<float>
                                      ((ParseResult *)local_5b8,&local_548,&local_1a0,local_570,
                                       psVar25,local_280);
                            if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                              operator_delete((void *)local_4f8._0_8_,
                                              CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                              operator_delete(local_1a0._M_dataplus._M_p,
                                              local_1a0.field_2._M_allocated_capacity + 1);
                            }
                            uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]));
                            iVar11 = 0;
                            if ((uVar21 & 0xfffffffd) == 0) {
                              iVar11 = 3;
LAB_002335b6:
                              bVar28 = false;
                            }
                            else {
                              bVar28 = true;
                              if (uVar21 != 1) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_4f8);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4f8,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4f8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           ,0x5a);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4f8,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4f8,"ReconstructShader",0x11);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4f8,"():",3);
                                poVar12 = (ostream *)
                                          ::std::ostream::operator<<
                                                    ((ostringstream *)local_4f8,0xfae);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                                local_5e8 = (undefined1  [8])&local_5d8;
                                ::std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_5e8,
                                           "Parsing attribute `{}` failed. Error: {}","");
                                fmt::format<char[19],std::__cxx11::string>
                                          ((string *)local_620,(fmt *)local_5e8,
                                           (string *)"inputs:dispacement",
                                           (char (*) [19])(local_5b8 + 8),psVar25);
                                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4f8,
                                                     (char *)CONCAT26(local_620._6_2_,
                                                                      local_620._0_6_),
                                                     CONCAT26(local_620._14_2_,
                                                              CONCAT24(local_620._12_2_,
                                                                       local_620._8_4_)));
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1)
                                ;
                                if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                                  operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                }
                                psVar25 = local_580;
                                if (local_5e8 != (undefined1  [8])&local_5d8) {
                                  operator_delete((void *)local_5e8,
                                                  local_5d8._M_allocated_capacity + 1);
                                }
                                if (psVar25 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  ::std::__cxx11::stringbuf::str();
                                  ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5e8,psVar25);
                                  ::std::__cxx11::string::operator=
                                            ((string *)psVar25,(string *)local_620);
                                  if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                       *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                                    operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                  }
                                  if (local_5e8 != (undefined1  [8])&local_5d8) {
                                    operator_delete((void *)local_5e8,
                                                    local_5d8._M_allocated_capacity + 1);
                                  }
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_4f8);
                                ::std::ios_base::~ios_base(local_488);
                                iVar11 = 1;
                                goto LAB_002335b6;
                              }
                            }
                            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT17(local_5b0[7],
                                                  CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                            if (paVar17 != local_5a0) {
                              operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                            }
                            if (bVar28) {
                              local_1c0._M_allocated_capacity = (size_type)local_1b0;
                              ::std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_1c0,*(long *)(p_Var20 + 1),
                                         (long)&(p_Var20[1]._M_parent)->_M_color +
                                         *(long *)(p_Var20 + 1));
                              psVar25 = (string *)local_4f8;
                              local_4f8._0_8_ = local_4e8;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)psVar25,"inputs:occlusion","");
                              anon_unknown_0::ParseTypedAttribute<float>
                                        ((ParseResult *)local_5b8,&local_548,(string *)&local_1c0,
                                         local_570,psVar25,local_288);
                              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                operator_delete((void *)local_4f8._0_8_,
                                                CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                              }
                              if ((long *)local_1c0._M_allocated_capacity != local_1b0) {
                                operator_delete((void *)local_1c0._M_allocated_capacity,
                                                local_1b0[0] + 1);
                              }
                              uVar21 = CONCAT13(local_5b8[3],CONCAT21(local_5b8._1_2_,local_5b8[0]))
                              ;
                              iVar11 = 0;
                              if ((uVar21 & 0xfffffffd) == 0) {
                                iVar11 = 3;
LAB_0023388b:
                                bVar28 = false;
                              }
                              else {
                                bVar28 = true;
                                if (uVar21 != 1) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_4f8);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4f8,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4f8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             ,0x5a);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4f8,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4f8,"ReconstructShader",0x11);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4f8,"():",3);
                                  poVar12 = (ostream *)
                                            ::std::ostream::operator<<
                                                      ((ostringstream *)local_4f8,0xfb0);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12," ",1);
                                  local_5e8 = (undefined1  [8])&local_5d8;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_5e8,
                                             "Parsing attribute `{}` failed. Error: {}","");
                                  fmt::format<char[17],std::__cxx11::string>
                                            ((string *)local_620,(fmt *)local_5e8,
                                             (string *)"inputs:occlusion",
                                             (char (*) [17])(local_5b8 + 8),psVar25);
                                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)local_4f8,
                                                       (char *)CONCAT26(local_620._6_2_,
                                                                        local_620._0_6_),
                                                       CONCAT26(local_620._14_2_,
                                                                CONCAT24(local_620._12_2_,
                                                                         local_620._8_4_)));
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,"\n",1);
                                  if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                       *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610) {
                                    operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                  }
                                  psVar25 = local_580;
                                  if (local_5e8 != (undefined1  [8])&local_5d8) {
                                    operator_delete((void *)local_5e8,
                                                    local_5d8._M_allocated_capacity + 1);
                                  }
                                  if (psVar25 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    ::std::__cxx11::stringbuf::str();
                                    ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5e8,psVar25);
                                    ::std::__cxx11::string::operator=
                                              ((string *)psVar25,(string *)local_620);
                                    if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                         *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610)
                                    {
                                      operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                    }
                                    if (local_5e8 != (undefined1  [8])&local_5d8) {
                                      operator_delete((void *)local_5e8,
                                                      local_5d8._M_allocated_capacity + 1);
                                    }
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_4f8);
                                  ::std::ios_base::~ios_base(local_488);
                                  iVar11 = 1;
                                  goto LAB_0023388b;
                                }
                              }
                              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT17(local_5b0[7],
                                                    CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                              if (paVar17 != local_5a0) {
                                operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                              }
                              if (bVar28) {
                                local_1e0._M_allocated_capacity = (size_type)&local_1d0;
                                ::std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_1e0,*(long *)(p_Var20 + 1),
                                           (long)&(p_Var20[1]._M_parent)->_M_color +
                                           *(long *)(p_Var20 + 1));
                                psVar25 = (string *)local_4f8;
                                local_4f8._0_8_ = local_4e8;
                                ::std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)psVar25,"inputs:useSpecularWorkflow","");
                                anon_unknown_0::ParseTypedAttribute<int>
                                          ((ParseResult *)local_5b8,&local_548,(string *)&local_1e0,
                                           local_570,psVar25,local_290);
                                if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                  operator_delete((void *)local_4f8._0_8_,
                                                  CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1e0._M_allocated_capacity != &local_1d0) {
                                  operator_delete((void *)local_1e0._M_allocated_capacity,
                                                  local_1d0._M_allocated_capacity + 1);
                                }
                                uVar21 = CONCAT13(local_5b8[3],
                                                  CONCAT21(local_5b8._1_2_,local_5b8[0]));
                                iVar11 = 0;
                                if ((uVar21 & 0xfffffffd) == 0) {
                                  iVar11 = 3;
LAB_00233b60:
                                  bVar28 = false;
                                }
                                else {
                                  bVar28 = true;
                                  if (uVar21 != 1) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_4f8);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4f8,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4f8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               ,0x5a);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4f8,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4f8,"ReconstructShader",0x11);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4f8,"():",3);
                                    poVar12 = (ostream *)
                                              ::std::ostream::operator<<
                                                        ((ostringstream *)local_4f8,0xfb2);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar12," ",1);
                                    local_5e8 = (undefined1  [8])&local_5d8;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_5e8,
                                               "Parsing attribute `{}` failed. Error: {}","");
                                    fmt::format<char[27],std::__cxx11::string>
                                              ((string *)local_620,(fmt *)local_5e8,
                                               (string *)"inputs:useSpecularWorkflow",
                                               (char (*) [27])(local_5b8 + 8),psVar25);
                                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)local_4f8,
                                                         (char *)CONCAT26(local_620._6_2_,
                                                                          local_620._0_6_),
                                                         CONCAT26(local_620._14_2_,
                                                                  CONCAT24(local_620._12_2_,
                                                                           local_620._8_4_)));
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar12,"\n",1);
                                    if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                         *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610)
                                    {
                                      operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                    }
                                    psVar25 = local_580;
                                    if (local_5e8 != (undefined1  [8])&local_5d8) {
                                      operator_delete((void *)local_5e8,
                                                      local_5d8._M_allocated_capacity + 1);
                                    }
                                    if (psVar25 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      ::std::__cxx11::stringbuf::str();
                                      ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5e8,psVar25);
                                      ::std::__cxx11::string::operator=
                                                ((string *)psVar25,(string *)local_620);
                                      if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                           *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610
                                         ) {
                                        operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                      }
                                      if (local_5e8 != (undefined1  [8])&local_5d8) {
                                        operator_delete((void *)local_5e8,
                                                        local_5d8._M_allocated_capacity + 1);
                                      }
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_4f8);
                                    ::std::ios_base::~ios_base(local_488);
                                    iVar11 = 1;
                                    goto LAB_00233b60;
                                  }
                                }
                                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT17(local_5b0[7],
                                                      CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                                if (paVar17 != local_5a0) {
                                  operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                                }
                                if (bVar28) {
                                  local_200._M_allocated_capacity = (size_type)local_1f0;
                                  ::std::__cxx11::string::_M_construct<char*>
                                            ((string *)&local_200,*(long *)(p_Var20 + 1),
                                             (long)&(p_Var20[1]._M_parent)->_M_color +
                                             *(long *)(p_Var20 + 1));
                                  psVar25 = (string *)local_4f8;
                                  local_4f8._0_8_ = local_4e8;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)psVar25,"outputs:surface","");
                                  anon_unknown_0::
                                  ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                                            ((ParseResult *)local_5b8,&local_548,
                                             (string *)&local_200,local_570,psVar25,local_2a0);
                                  if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                    operator_delete((void *)local_4f8._0_8_,
                                                    CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1);
                                  }
                                  if ((_Alloc_hider *)local_200._M_allocated_capacity != local_1f0)
                                  {
                                    operator_delete((void *)local_200._M_allocated_capacity,
                                                    (ulong)(local_1f0[0]._M_p + 1));
                                  }
                                  uVar21 = CONCAT13(local_5b8[3],
                                                    CONCAT21(local_5b8._1_2_,local_5b8[0]));
                                  iVar11 = 0;
                                  if ((uVar21 & 0xfffffffd) == 0) {
                                    iVar11 = 3;
LAB_00233e35:
                                    bVar28 = false;
                                  }
                                  else {
                                    bVar28 = true;
                                    if (uVar21 != 1) {
                                      ::std::__cxx11::ostringstream::ostringstream
                                                ((ostringstream *)local_4f8);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4f8,"[error]",7);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4f8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 ,0x5a);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4f8,":",1);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4f8,"ReconstructShader",0x11);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4f8,"():",3);
                                      poVar12 = (ostream *)
                                                ::std::ostream::operator<<
                                                          ((ostringstream *)local_4f8,0xfb4);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar12," ",1);
                                      local_5e8 = (undefined1  [8])&local_5d8;
                                      ::std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_5e8,
                                                 "Parsing shader output property `{}` failed. Error: {}"
                                                 ,"");
                                      fmt::format<char[16],std::__cxx11::string>
                                                ((string *)local_620,(fmt *)local_5e8,
                                                 (string *)"outputs:surface",
                                                 (char (*) [16])(local_5b8 + 8),psVar25);
                                      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)local_4f8,
                                                           (char *)CONCAT26(local_620._6_2_,
                                                                            local_620._0_6_),
                                                           CONCAT26(local_620._14_2_,
                                                                    CONCAT24(local_620._12_2_,
                                                                             local_620._8_4_)));
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar12,"\n",1);
                                      if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                           *)CONCAT26(local_620._6_2_,local_620._0_6_) != &local_610
                                         ) {
                                        operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                      }
                                      psVar25 = local_580;
                                      if (local_5e8 != (undefined1  [8])&local_5d8) {
                                        operator_delete((void *)local_5e8,
                                                        local_5d8._M_allocated_capacity + 1);
                                      }
                                      if (psVar25 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        ::std::__cxx11::stringbuf::str();
                                        ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5e8,psVar25);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)psVar25,(string *)local_620);
                                        if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                             *)CONCAT26(local_620._6_2_,local_620._0_6_) !=
                                            &local_610) {
                                          operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                        }
                                        if (local_5e8 != (undefined1  [8])&local_5d8) {
                                          operator_delete((void *)local_5e8,
                                                          local_5d8._M_allocated_capacity + 1);
                                        }
                                      }
                                      ::std::__cxx11::ostringstream::~ostringstream
                                                ((ostringstream *)local_4f8);
                                      ::std::ios_base::~ios_base(local_488);
                                      iVar11 = 1;
                                      goto LAB_00233e35;
                                    }
                                  }
                                  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)CONCAT17(local_5b0[7],
                                                        CONCAT43(local_5b0._3_4_,local_5b0._0_3_));
                                  if (paVar17 != local_5a0) {
                                    operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1);
                                  }
                                  if (bVar28) {
                                    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                                    ::std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_220,*(long *)(p_Var20 + 1),
                                               (long)&(p_Var20[1]._M_parent)->_M_color +
                                               *(long *)(p_Var20 + 1));
                                    psVar25 = (string *)local_4f8;
                                    local_4f8._0_8_ = local_4e8;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)psVar25,"outputs:displacement","");
                                    anon_unknown_0::
                                    ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                                              ((ParseResult *)local_5b8,&local_548,&local_220,
                                               local_570,psVar25,local_2a8);
                                    if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                                      operator_delete((void *)local_4f8._0_8_,
                                                      CONCAT26(local_4e8._6_2_,local_4e8._0_6_) + 1)
                                      ;
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_220._M_dataplus._M_p != &local_220.field_2) {
                                      operator_delete(local_220._M_dataplus._M_p,
                                                      local_220.field_2._M_allocated_capacity + 1);
                                    }
                                    uVar21 = CONCAT13(local_5b8[3],
                                                      CONCAT21(local_5b8._1_2_,local_5b8[0]));
                                    iVar11 = 0;
                                    if ((uVar21 & 0xfffffffd) == 0) {
                                      iVar11 = 3;
LAB_00234128:
                                      bVar28 = false;
                                    }
                                    else {
                                      bVar28 = true;
                                      if (uVar21 != 1) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_4f8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,"[error]",7);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,"ReconstructShader",0x11);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,"():",3);
                                        poVar12 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((ostringstream *)local_4f8,0xfb6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12," ",1);
                                        local_5e8 = (undefined1  [8])&local_5d8;
                                        ::std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_5e8,
                                                                                                      
                                                  "Parsing shader output property `{}` failed. Error: {}"
                                                  ,"");
                                        fmt::format<char[21],std::__cxx11::string>
                                                  ((string *)local_620,(fmt *)local_5e8,
                                                   (string *)"outputs:displacement",
                                                   (char (*) [21])(local_5b8 + 8),psVar25);
                                        poVar12 = ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_4f8,
                                                             (char *)CONCAT26(local_620._6_2_,
                                                                              local_620._0_6_),
                                                             CONCAT26(local_620._14_2_,
                                                                      CONCAT24(local_620._12_2_,
                                                                               local_620._8_4_)));
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12,"\n",1);
                                        if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                             *)CONCAT26(local_620._6_2_,local_620._0_6_) !=
                                            &local_610) {
                                          operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                        }
                                        psVar25 = local_580;
                                        if (local_5e8 != (undefined1  [8])&local_5d8) {
                                          operator_delete((void *)local_5e8,
                                                          local_5d8._M_allocated_capacity + 1);
                                        }
                                        if (psVar25 != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          psVar25 = local_580;
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5e8,local_580);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)psVar25,(string *)local_620);
                                          if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                               *)CONCAT26(local_620._6_2_,local_620._0_6_) !=
                                              &local_610) {
                                            operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                          }
                                          p_Var20 = local_568;
                                          if (local_5e8 != (undefined1  [8])&local_5d8) {
                                            operator_delete((void *)local_5e8,
                                                            local_5d8._M_allocated_capacity + 1);
                                            p_Var20 = local_568;
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_4f8);
                                        ::std::ios_base::~ios_base(local_488);
                                        iVar11 = 1;
                                        goto LAB_00234128;
                                      }
                                    }
                                    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)CONCAT17(local_5b0[7],
                                                          CONCAT43(local_5b0._3_4_,local_5b0._0_3_))
                                    ;
                                    if (paVar17 != local_5a0) {
                                      operator_delete(paVar17,local_5a0[0]._M_allocated_capacity + 1
                                                     );
                                    }
                                    if (bVar28) {
                                      p_Var26 = p_Var20 + 1;
                                      cVar19 = ::std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_548,(key_type *)p_Var26);
                                      if ((_Rb_tree_header *)cVar19._M_node ==
                                          &local_548._M_t._M_impl.super__Rb_tree_header) {
                                        this = ::std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                               ::operator[](local_2b0,(key_type *)p_Var26);
                                        Property::operator=(this,local_570);
                                        ::std::
                                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        ::_M_insert_unique<std::__cxx11::string_const&>
                                                  ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_548,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var26);
                                      }
                                      cVar19 = ::std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_548,(key_type *)p_Var26);
                                      iVar11 = 0;
                                      if ((_Rb_tree_header *)cVar19._M_node ==
                                          &local_548._M_t._M_impl.super__Rb_tree_header) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_4f8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,"[warn]",6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,"ReconstructShader",0x11);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4f8,"():",3);
                                        poVar12 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((ostringstream *)local_4f8,0xfb8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12," ",1);
                                        ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5b8,"Unsupported/unimplemented property: "
                                                  ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var26);
                                        poVar12 = ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_4f8,
                                                             (char *)CONCAT44(local_5b8._4_4_,
                                                                              CONCAT13(local_5b8[3],
                                                                                       CONCAT21(
                                                  local_5b8._1_2_,local_5b8[0]))),
                                                  CONCAT17(local_5b0[7],
                                                           CONCAT43(local_5b0._3_4_,local_5b0._0_3_)
                                                          ));
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12,"\n",1);
                                        puVar18 = (undefined1 *)
                                                  CONCAT44(local_5b8._4_4_,
                                                           CONCAT13(local_5b8[3],
                                                                    CONCAT21(local_5b8._1_2_,
                                                                             local_5b8[0])));
                                        if (puVar18 != local_5b0 + 8) {
                                          operator_delete(puVar18,CONCAT26(local_5b0._14_2_,
                                                                           local_5b0._8_6_) + 1);
                                        }
                                        if (local_330 != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5b8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_620,local_580);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)local_330,(string *)local_5b8);
                                          puVar18 = (undefined1 *)
                                                    CONCAT44(local_5b8._4_4_,
                                                             CONCAT13(local_5b8[3],
                                                                      CONCAT21(local_5b8._1_2_,
                                                                               local_5b8[0])));
                                          if (puVar18 != local_5b0 + 8) {
                                            operator_delete(puVar18,CONCAT26(local_5b0._14_2_,
                                                                             local_5b0._8_6_) + 1);
                                          }
                                          if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                               *)CONCAT26(local_620._6_2_,local_620._0_6_) !=
                                              &local_610) {
                                            operator_delete((
                                                  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)CONCAT26(local_620._6_2_,local_620._0_6_),
                                                  (long)local_610.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_4f8);
                                        ::std::ios_base::~ios_base(local_488);
                                        p_Var20 = local_568;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((iVar11 != 3) && (iVar11 != 0)) break;
      p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      local_5b9 = p_Var20 == local_228;
    } while (!local_5b9);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_548,
             (_Link_type)local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(local_5b9 & 1);
}

Assistant:

bool ReconstructShader<UsdPreviewSurface>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPreviewSurface *surface,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)references;
  (void)options;

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuseColor", UsdPreviewSurface,
                         surface->diffuseColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:emissiveColor", UsdPreviewSurface,
                         surface->emissiveColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:roughness", UsdPreviewSurface,
                         surface->roughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specularColor", UsdPreviewSurface,
                         surface->specularColor)  // specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:metallic", UsdPreviewSurface,
                         surface->metallic)  // non specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoat", UsdPreviewSurface,
                         surface->clearcoat)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoatRoughness",
                         UsdPreviewSurface, surface->clearcoatRoughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacity", UsdPreviewSurface,
                         surface->opacity)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacityThreshold",
                         UsdPreviewSurface, surface->opacityThreshold)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:ior", UsdPreviewSurface,
                         surface->ior)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:normal", UsdPreviewSurface,
                         surface->normal)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:dispacement", UsdPreviewSurface,
                         surface->displacement)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:occlusion", UsdPreviewSurface,
                         surface->occlusion)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:useSpecularWorkflow",
                         UsdPreviewSurface, surface->useSpecularWorkflow)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:surface", UsdPreviewSurface,
                   surface->outputsSurface)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:displacement", UsdPreviewSurface,
                   surface->outputsDisplacement)
    ADD_PROPERTY(table, prop, UsdPreviewSurface, surface->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}